

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

string * pbrt::detail::
         DispatchCPU<pbrt::LightSampler::ToString[abi:cxx11]()const::__0&,std::__cxx11::string,pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::ExhaustiveLightSampler,pbrt::BVHLightSampler>
                   (anon_class_1_0_00000001 *func,void *ptr,int index)

{
  int in_ECX;
  string *in_RDI;
  
  if (in_ECX == 0) {
    const::$_0::operator()((anon_class_1_0_00000001 *)in_RDI,(UniformLightSampler *)in_RDI);
  }
  else if (in_ECX == 1) {
    const::$_0::operator()((anon_class_1_0_00000001 *)in_RDI,(PowerLightSampler *)in_RDI);
  }
  else if (in_ECX == 2) {
    const::$_0::operator()((anon_class_1_0_00000001 *)in_RDI,(ExhaustiveLightSampler *)in_RDI);
  }
  else {
    const::$_0::operator()((anon_class_1_0_00000001 *)in_RDI,(BVHLightSampler *)in_RDI);
  }
  return in_RDI;
}

Assistant:

auto DispatchCPU(F &&func, const void *ptr, int index) {
    DCHECK_GE(index, 0);
    DCHECK_LT(index, 4);

    switch (index) {
    case 0:
        return func((const T0 *)ptr);
    case 1:
        return func((const T1 *)ptr);
    case 2:
        return func((const T2 *)ptr);
    default:
        return func((const T3 *)ptr);
    }
}